

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::App::loadConfigOptions(App *this,AppTextParser *aparser)

{
  bool bVar1;
  string *psVar2;
  AppTextParser *in_RSI;
  istream *in_RDI;
  istringstream sstr;
  App *in_stack_000000e8;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  string *configStr;
  App *in_stack_fffffffffffffe50;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_fffffffffffffe60;
  
  psVar2 = AppTextParser::configString_abi_cxx11_(in_RSI);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x207dd5);
  if (!bVar1) {
    generateParser(in_stack_000000e8);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&stack0xfffffffffffffe60,(string *)psVar2,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x207e14);
    CLI::App::parse_from_stream(in_stack_fffffffffffffe50,in_RDI);
    std::__cxx11::istringstream::~istringstream((istringstream *)&stack0xfffffffffffffe60);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    ~unique_ptr(in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void App::loadConfigOptions(AppTextParser& aparser)
{
    const auto& configStr = aparser.configString();
    if (!configStr.empty()) {
        auto app = generateParser();
        std::istringstream sstr(configStr);
        app->parse_from_stream(sstr);
    }
}